

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O2

void __thiscall GlobalMemoryAccountant::start(GlobalMemoryAccountant *this)

{
  UtestShell *pUVar1;
  TestTerminator *pTVar2;
  AccountingTestMemoryAllocator *pAVar3;
  TestMemoryAllocator *pTVar4;
  
  if (this->mallocAllocator_ != (AccountingTestMemoryAllocator *)0x0) {
    pUVar1 = UtestShell::getCurrent();
    pTVar2 = UtestShell::getCurrentTestTerminator();
    (*pUVar1->_vptr_UtestShell[0x1a])
              (pUVar1,"Global allocator start called twice!",
               "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
               ,0x2db,pTVar2);
  }
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2dd);
  pTVar4 = getCurrentMallocAllocator();
  (pAVar3->super_TestMemoryAllocator).name_ = "generic";
  (pAVar3->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar3->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar3->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar3->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00167378;
  pAVar3->accountant_ = &this->accountant_;
  pAVar3->originalAllocator_ = pTVar4;
  pAVar3->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->mallocAllocator_ = pAVar3;
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2de);
  pTVar4 = getCurrentNewAllocator();
  (pAVar3->super_TestMemoryAllocator).name_ = "generic";
  (pAVar3->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar3->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar3->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar3->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00167378;
  pAVar3->accountant_ = &this->accountant_;
  pAVar3->originalAllocator_ = pTVar4;
  pAVar3->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->newAllocator_ = pAVar3;
  pAVar3 = (AccountingTestMemoryAllocator *)
           operator_new(0x40,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/src/CppUTest/TestMemoryAllocator.cpp"
                        ,0x2df);
  pTVar4 = getCurrentNewArrayAllocator();
  (pAVar3->super_TestMemoryAllocator).name_ = "generic";
  (pAVar3->super_TestMemoryAllocator).alloc_name_ = "alloc";
  (pAVar3->super_TestMemoryAllocator).free_name_ = "free";
  (pAVar3->super_TestMemoryAllocator).hasBeenDestroyed_ = false;
  (pAVar3->super_TestMemoryAllocator)._vptr_TestMemoryAllocator =
       (_func_int **)&PTR__MemoryLeakAllocator_00167378;
  pAVar3->accountant_ = &this->accountant_;
  pAVar3->originalAllocator_ = pTVar4;
  pAVar3->head_ = (AccountingTestMemoryAllocatorMemoryNode *)0x0;
  this->newArrayAllocator_ = pAVar3;
  pTVar4 = getCurrentMallocAllocator();
  (this->accountant_).allocator_ = pTVar4;
  currentMallocAllocator = &this->mallocAllocator_->super_TestMemoryAllocator;
  currentNewAllocator = &this->newAllocator_->super_TestMemoryAllocator;
  currentNewArrayAllocator = &this->newArrayAllocator_->super_TestMemoryAllocator;
  return;
}

Assistant:

void GlobalMemoryAccountant::start()
{
    if (mallocAllocator_ != NULLPTR)
      FAIL("Global allocator start called twice!");

    mallocAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentMallocAllocator());
    newAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewAllocator());
    newArrayAllocator_ = new AccountingTestMemoryAllocator(accountant_, getCurrentNewArrayAllocator());

    accountant_.setAllocator(getCurrentMallocAllocator());

    setCurrentMallocAllocator(mallocAllocator_);
    setCurrentNewAllocator(newAllocator_);
    setCurrentNewArrayAllocator(newArrayAllocator_);
}